

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  int i_2;
  long lVar2;
  undefined1 *puVar3;
  int i_1;
  int iVar4;
  int i;
  long lVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  uint32_t out_counters [16];
  __m512i masks [16];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  puVar3 = local_9c0;
  lVar2 = 0;
  lVar5 = 0;
  while (lVar5 != 0x10) {
    *(undefined8 *)(local_980 + lVar2) = 0;
    *(undefined8 *)(local_980 + lVar2 + 8) = 0;
    *(undefined8 *)(local_980 + lVar2 + 0x10) = 0;
    *(undefined8 *)(local_980 + lVar2 + 0x18) = 0;
    *(undefined8 *)(local_980 + lVar2 + 0x20) = 0;
    *(undefined8 *)(local_980 + lVar2 + 0x28) = 0;
    *(undefined8 *)(local_980 + lVar2 + 0x30) = 0;
    *(undefined8 *)(local_980 + lVar2 + 0x38) = 0;
    lVar5 = lVar5 + 1;
    auVar6 = vpbroadcastw_avx512bw();
    auVar6 = vmovdqa64_avx512f(auVar6);
    *(undefined1 (*) [64])((long)&local_480 + lVar2) = auVar6;
    lVar2 = lVar2 + 0x40;
  }
  auVar6 = vmovdqa64_avx512f(local_400);
  auVar7 = vmovdqa64_avx512f(local_940);
  auVar8 = vmovdqa64_avx512f(local_900);
  auVar9 = vmovdqa64_avx512f(local_8c0);
  auVar10 = vmovdqa64_avx512f(local_380);
  auVar11 = vmovdqa64_avx512f(local_340);
  auVar12 = vmovdqa64_avx512f(local_300);
  auVar13 = vmovdqa64_avx512f(local_2c0);
  auVar14 = vmovdqa64_avx512f(local_280);
  auVar15 = vmovdqa64_avx512f(local_240);
  auVar16 = vmovdqa64_avx512f(local_200);
  auVar17 = vmovdqa64_avx512f(local_1c0);
  auVar18 = vmovdqa64_avx512f(local_180);
  auVar19 = vmovdqa64_avx512f(local_140);
  auVar20 = vmovdqa64_avx512f(local_100);
  auVar21 = vmovdqa64_avx512f(local_c0);
  auVar22 = vmovdqa64_avx512f(local_880);
  auVar23 = vmovdqa64_avx512f(local_840);
  auVar24 = vmovdqa64_avx512f(local_800);
  auVar25 = vmovdqa64_avx512f(local_7c0);
  auVar26 = vmovdqa64_avx512f(local_780);
  auVar27 = vmovdqa64_avx512f(local_740);
  auVar28 = vmovdqa64_avx512f(local_700);
  auVar29 = vmovdqa64_avx512f(local_6c0);
  auVar30 = vmovdqa64_avx512f(local_680);
  auVar31 = vmovdqa64_avx512f(local_640);
  auVar32 = vmovdqa64_avx512f(local_600);
  auVar33 = vmovdqa64_avx512f(local_5c0);
  lVar2 = 0;
  local_9c0 = ZEXT464(0) << 0x40;
  auVar34 = vmovdqa64_avx512f(local_980);
  local_4c0 = local_480;
  uStack_4b8 = uStack_478;
  uStack_4b0 = uStack_470;
  uStack_4a8 = uStack_468;
  uStack_4a0 = uStack_460;
  uStack_498 = uStack_458;
  uStack_490 = uStack_450;
  uStack_488 = uStack_448;
  local_500 = local_440;
  uStack_4f8 = uStack_438;
  uStack_4f0 = uStack_430;
  uStack_4e8 = uStack_428;
  uStack_4e0 = uStack_420;
  uStack_4d8 = uStack_418;
  uStack_4d0 = uStack_410;
  uStack_4c8 = uStack_408;
  auVar35 = vmovdqa64_avx512f(local_3c0);
  auVar36 = vpbroadcastd_avx512f(ZEXT416(1));
  local_540 = vmovdqa64_avx512f(auVar6);
  local_580 = vmovdqa64_avx512f(auVar35);
  while ((ulong)(len >> 5) << 6 != lVar2) {
    auVar37 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + lVar2));
    lVar2 = lVar2 + 0x40;
    auVar35._8_8_ = uStack_478;
    auVar35._0_8_ = local_480;
    auVar35._16_8_ = uStack_470;
    auVar35._24_8_ = uStack_468;
    auVar35._32_8_ = uStack_460;
    auVar35._40_8_ = uStack_458;
    auVar35._48_8_ = uStack_450;
    auVar35._56_8_ = uStack_448;
    auVar6 = vpandq_avx512f(auVar37,auVar35);
    auVar35 = vpsrld_avx512f(auVar6,0x10);
    auVar6 = vpandd_avx512f(auVar6,auVar36);
    auVar34 = vpaddd_avx512f(auVar35,auVar34);
    auVar34 = vpaddd_avx512f(auVar34,auVar6);
    auVar6._8_8_ = uStack_438;
    auVar6._0_8_ = local_440;
    auVar6._16_8_ = uStack_430;
    auVar6._24_8_ = uStack_428;
    auVar6._32_8_ = uStack_420;
    auVar6._40_8_ = uStack_418;
    auVar6._48_8_ = uStack_410;
    auVar6._56_8_ = uStack_408;
    auVar6 = vpandq_avx512f(auVar37,auVar6);
    auVar35 = vpsrld_avx512f(auVar6,1);
    auVar6 = vpsrld_avx512f(auVar6,0x11);
    auVar6 = vpaddd_avx512f(auVar6,auVar7);
    auVar38 = vpandq_avx512f(auVar37,local_540);
    auVar7 = vpandd_avx512f(auVar35,auVar36);
    auVar7 = vpaddd_avx512f(auVar6,auVar7);
    auVar6 = vpsrld_avx512f(auVar38,2);
    auVar35 = vpsrld_avx512f(auVar38,0x12);
    auVar8 = vpaddd_avx512f(auVar35,auVar8);
    auVar35 = vpandq_avx512f(auVar37,local_580);
    auVar6 = vpandd_avx512f(auVar6,auVar36);
    auVar8 = vpaddd_avx512f(auVar8,auVar6);
    auVar6 = vpsrld_avx512f(auVar35,3);
    auVar35 = vpsrld_avx512f(auVar35,0x13);
    auVar9 = vpaddd_avx512f(auVar35,auVar9);
    auVar6 = vpandd_avx512f(auVar6,auVar36);
    auVar35 = vpandq_avx512f(auVar10,auVar37);
    auVar9 = vpaddd_avx512f(auVar9,auVar6);
    auVar6 = vpsrld_avx512f(auVar35,4);
    auVar35 = vpsrld_avx512f(auVar35,0x14);
    auVar6 = vpandd_avx512f(auVar6,auVar36);
    auVar22 = vpaddd_avx512f(auVar35,auVar22);
    auVar22 = vpaddd_avx512f(auVar22,auVar6);
    auVar6 = vpandq_avx512f(auVar11,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,5);
    auVar6 = vpsrld_avx512f(auVar6,0x15);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar23);
    auVar23 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar12,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,6);
    auVar6 = vpsrld_avx512f(auVar6,0x16);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar24);
    auVar24 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar13,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,7);
    auVar6 = vpsrld_avx512f(auVar6,0x17);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar25);
    auVar25 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar14,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,8);
    auVar6 = vpsrld_avx512f(auVar6,0x18);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar26);
    auVar26 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar15,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,9);
    auVar6 = vpsrld_avx512f(auVar6,0x19);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar27);
    auVar27 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar16,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,10);
    auVar6 = vpsrld_avx512f(auVar6,0x1a);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar28);
    auVar28 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar17,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,0xb);
    auVar6 = vpsrld_avx512f(auVar6,0x1b);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar29);
    auVar29 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar18,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,0xc);
    auVar6 = vpsrld_avx512f(auVar6,0x1c);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar30);
    auVar30 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar19,auVar37);
    auVar35 = vpsrld_avx512f(auVar6,0xd);
    auVar6 = vpsrld_avx512f(auVar6,0x1d);
    auVar35 = vpandd_avx512f(auVar35,auVar36);
    auVar6 = vpaddd_avx512f(auVar6,auVar31);
    auVar31 = vpaddd_avx512f(auVar6,auVar35);
    auVar6 = vpandq_avx512f(auVar20,auVar37);
    auVar35 = vpandq_avx512f(auVar21,auVar37);
    auVar37 = vpsrld_avx512f(auVar6,0x1e);
    auVar6 = vpsrld_avx512f(auVar6,0xe);
    auVar32 = vpaddd_avx512f(auVar37,auVar32);
    auVar6 = vpandd_avx512f(auVar6,auVar36);
    auVar32 = vpaddd_avx512f(auVar32,auVar6);
    auVar6 = vpsrld_avx512f(auVar35,0x1f);
    auVar35 = vpsrld_avx512f(auVar35,0xf);
    auVar6 = vpaddd_avx512f(auVar6,auVar33);
    auVar33 = vpandd_avx512f(auVar35,auVar36);
    auVar33 = vpaddd_avx512f(auVar6,auVar33);
  }
  local_940 = vmovdqa64_avx512f(auVar7);
  local_900 = vmovdqa64_avx512f(auVar8);
  local_8c0 = vmovdqa64_avx512f(auVar9);
  local_880 = vmovdqa64_avx512f(auVar22);
  local_840 = vmovdqa64_avx512f(auVar23);
  local_800 = vmovdqa64_avx512f(auVar24);
  local_7c0 = vmovdqa64_avx512f(auVar25);
  local_780 = vmovdqa64_avx512f(auVar26);
  local_740 = vmovdqa64_avx512f(auVar27);
  local_700 = vmovdqa64_avx512f(auVar28);
  local_6c0 = vmovdqa64_avx512f(auVar29);
  local_680 = vmovdqa64_avx512f(auVar30);
  local_640 = vmovdqa64_avx512f(auVar31);
  local_600 = vmovdqa64_avx512f(auVar32);
  local_5c0 = vmovdqa64_avx512f(auVar33);
  local_980 = vmovdqa64_avx512f(auVar34);
  for (lVar2 = (long)(int)(len & 0xffffffe0); (uint)lVar2 < len; lVar2 = lVar2 + 1) {
    uVar1 = data[lVar2];
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      *(uint *)(local_9c0 + lVar5 * 4) =
           *(int *)(local_9c0 + lVar5 * 4) + (uint)((uVar1 >> ((uint)lVar5 & 0x1f) & 1) != 0);
    }
  }
  for (lVar2 = 0; puVar3 = puVar3 + 0x40, lVar2 != 0x10; lVar2 = lVar2 + 1) {
    iVar4 = *(int *)(local_9c0 + lVar2 * 4);
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      iVar4 = iVar4 + *(int *)(puVar3 + lVar5 * 4);
    }
    *(int *)(local_9c0 + lVar2 * 4) = iVar4;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    flags[lVar2] = *(uint32_t *)(local_9c0 + lVar2 * 4);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i masks[16];
    __m512i counters[16];
    const __m512i one_mask = _mm512_set1_epi32(1);
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm512_set1_epi16(1 << i);
        counters[i] = _mm512_set1_epi32(0);
    }
    uint32_t out_counters[16] = {0};

    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

#define UPDATE(pos) {                                            \
    __m512i a   = _mm512_and_epi32(_mm512_loadu_si512(data_vectors+i), masks[pos]); \
    __m512i d   = _mm512_add_epi32(_mm512_and_epi32(_mm512_srli_epi32(a, pos), one_mask), _mm512_srli_epi32(a, pos+16)); \
    counters[pos] = _mm512_add_epi32(counters[pos], d);          \
}
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    for (int i = 0; i < n_cycles; ++i) {
        BLOCK
    }

#undef BLOCK
#undef UPDATE

    // residual
    for (int i = n_cycles*32; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) {
        uint32_t* v = (uint32_t*)(&counters[i]);
        for (int j = 0; j < 16; ++j)
            out_counters[i] += v[j];
    }
 
    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}